

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O1

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingHalfOpaquePixelIsBlended
          (GenericRGBXBlenderTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  color cVar4;
  color cVar5;
  color cVar6;
  color cVar7;
  FailedAssertion *pFVar8;
  string local_98;
  string local_78;
  LocationInfo local_58;
  
  cVar4 = color::make('\x10',' ','0',0xff);
  cVar5 = color::make('\x10',' ','0',0xff);
  cVar6 = color::make('\x10',' ','0',0xff);
  cVar7 = color::make('\x10',' ','0',0xff);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0xaa);
  iVar3 = (((uint)cVar4 >> 0x18) * 0x40 + (((uint)cVar4 >> 0x18) * 0x1f9) / 1000) * 0xa0;
  if (((((((uint)cVar4 & 0xff) + 0x3fffffdb) * iVar3 & 0x3fc00000) != 0x3c800000) ||
      (((((uint)cVar4 >> 8 & 0xff) + 0x3fffffb9) * iVar3 & 0x3fc00000) != 0x39c00000)) ||
     (((((uint)cVar4 >> 0x10 & 0xff) + 0x3fffff66) * iVar3 & 0x3fc00000) != 0x2f400000)) {
    pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar8,&local_78,&local_58);
    __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar1 = &local_58.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0xab);
  iVar3 = (((uint)cVar5 >> 0x18) * 0x40 + (((uint)cVar5 >> 0x18) * 0x1f9) / 1000) * 0xa0;
  if (((((((uint)cVar5 & 0xff) + 0x3fffff66) * iVar3 & 0x3fc00000) != 0x2a400000) ||
      (((((uint)cVar5 >> 8 & 0xff) + 0x3fffffb9) * iVar3 & 0x3fc00000) != 0x39c00000)) ||
     (((((uint)cVar5 >> 0x10 & 0xff) + 0x3fffffdb) * iVar3 & 0x3fc00000) != 0x1800000)) {
    pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar8,&local_78,&local_58);
    __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0xac);
  iVar3 = (((uint)cVar6 >> 0x18) * 0x40 + (((uint)cVar6 >> 0x18) * 0x1f9) / 1000) * 0xa0;
  if (((((((uint)cVar6 & 0xff) + 0x3fffffb9) * iVar3 & 0x3fc00000) != 0x37400000) ||
      (((((uint)cVar6 >> 8 & 0xff) + 0x3fffff66) * iVar3 & 0x3fc00000) != 0x2cc00000)) ||
     (((((uint)cVar6 >> 0x10 & 0xff) + 0x3fffff55) * iVar3 & 0x3fc00000) != 0x2c800000)) {
    pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar8,&local_78,&local_58);
    __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_58,&local_98,0xad);
  iVar3 = (((uint)cVar7 >> 0x18) * 0x40 + (((uint)cVar7 >> 0x18) * 0x1f9) / 1000) * 0xa0;
  if (((((((uint)cVar7 & 0xff) + 0x3fffff55) * iVar3 & 0x3fc00000) == 0x27800000) &&
      (((((uint)cVar7 >> 8 & 0xff) + 0x3fffff66) * iVar3 & 0x3fc00000) == 0x2cc00000)) &&
     (((((uint)cVar7 >> 0x10 & 0xff) + 0x3fffffb9) * iVar3 & 0x3fc00000) == 0x3c400000)) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    return;
  }
  pFVar8 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Values are not equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar8,&local_78,&local_58);
  __cxa_throw(pFVar8,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( BlendingHalfOpaquePixelIsBlended )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel1;
				typedef mocks::pixel_rgbx<order_bgra> pixel2;
				typedef mocks::pixel_rgbx<order_argb> pixel3;
				typedef mocks::pixel_rgbx<order_abgr> pixel4;

				// INIT
				const uint8_t cover = 0xA0;
				blender_solid_color_rgb<pixel1, order_rgba> b1(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel2, order_bgra> b2(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel3, order_argb> b3(color::make(0x10, 0x20, 0x30));
				blender_solid_color_rgb<pixel4, order_abgr> b4(color::make(0x10, 0x20, 0x30));
				pixel1 dest1 = { { 0x25, 0x47, 0x9A, 0xAB } };
				pixel2 dest2 = { { 0x25, 0x47, 0x9A, 0xAB } };
				pixel3 dest3 = { { 0x25, 0x47, 0x9A, 0xAB } };
				pixel4 dest4 = { { 0x25, 0x47, 0x9A, 0xAB } };

				// ACT
				b1(&dest1, 0, 0, 1, &cover);
				b2(&dest2, 0, 0, 1, &cover);
				b3(&dest3, 0, 0, 1, &cover);
				b4(&dest4, 0, 0, 1, &cover);

				// ASSERT
				pixel1 reference1 = { { 0x17, 0x2E, 0x57 } };
				pixel2 reference2 = { { 0x2B, 0x2E, 0x43 } };
				pixel3 reference3 = { { 0, 0x24, 0x4D, 0x5D } };
				pixel4 reference4 = { { 0, 0x38, 0x4D, 0x49 } };

				assert_equal(reference1, dest1);
				assert_equal(reference2, dest2);
				assert_equal(reference3, dest3);
				assert_equal(reference4, dest4);
			}